

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall Lowerer::GenerateFastArrayIsIn(Lowerer *this,Instr *instr)

{
  undefined8 uVar1;
  bool bVar2;
  IRType type;
  uint32 uVar3;
  LabelInstr *labelFail;
  LabelInstr *target;
  LabelInstr *target_00;
  RegOpnd *pRVar4;
  Opnd *pOVar5;
  RegOpnd *pRVar6;
  IndirOpnd *pIVar7;
  IntConstOpnd *pIVar8;
  Opnd *src;
  byte local_d9;
  Opnd *headSegmentLengthOpnd;
  RegOpnd *headSegmentOpnd;
  IndirOpnd *indirOpnd;
  AutoReuseOpnd autoReuseHeadSegmentLengthOpnd;
  AutoReuseOpnd autoReuseHeadSegmentOpnd;
  Opnd *vtableOpnd;
  RegOpnd *arrayOpnd;
  undefined1 local_70 [8];
  AutoReuseOpnd autoReuseArrayOpnd;
  RegOpnd *src2RegOpnd;
  RegOpnd *src1Untagged;
  LabelInstr *isArrayLabel;
  LabelInstr *doneLabel;
  LabelInstr *helperLabel;
  Opnd *local_28;
  Opnd *src2;
  Opnd *src1;
  Instr *instr_local;
  Lowerer *this_local;
  
  src1 = (Opnd *)instr;
  instr_local = (Instr *)this;
  src2 = IR::Instr::GetSrc1(instr);
  local_28 = IR::Instr::GetSrc2((Instr *)src1);
  helperLabel._6_2_ =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       IR::Opnd::GetValueType(src2);
  bVar2 = ValueType::IsLikelyInt((ValueType *)((long)&helperLabel + 6));
  local_d9 = 1;
  if (bVar2) {
    bVar2 = IR::Opnd::IsNotInt(src2);
    local_d9 = 1;
    if (!bVar2) {
      helperLabel._4_2_ =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           IR::Opnd::GetValueType(local_28);
      bVar2 = ValueType::IsLikelyArray((ValueType *)((long)&helperLabel + 4));
      local_d9 = 1;
      if (bVar2) {
        helperLabel._2_2_ =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             IR::Opnd::GetValueType(local_28);
        bVar2 = ValueType::HasNoMissingValues((ValueType *)((long)&helperLabel + 2));
        local_d9 = bVar2 ^ 0xff;
      }
    }
  }
  if ((local_d9 & 1) == 0) {
    labelFail = IR::LabelInstr::New(Label,this->m_func,true);
    target = IR::LabelInstr::New(Label,this->m_func,false);
    target_00 = IR::LabelInstr::New(Label,this->m_func,false);
    pRVar4 = IR::Opnd::AsRegOpnd(src2);
    pRVar4 = GenerateUntagVar(this,pRVar4,labelFail,(Instr *)src1,true);
    autoReuseArrayOpnd._16_8_ = IR::RegOpnd::New(TyUint64,this->m_func);
    InsertMove((Opnd *)autoReuseArrayOpnd._16_8_,local_28,(Instr *)src1,true);
    IR::AutoReuseOpnd::AutoReuseOpnd((AutoReuseOpnd *)local_70);
    LowererMD::GenerateObjectTest
              (&this->m_lowererMD,(Opnd *)autoReuseArrayOpnd._16_8_,(Instr *)src1,labelFail,false);
    pOVar5 = IR::Opnd::Copy((Opnd *)autoReuseArrayOpnd._16_8_,(Func *)src1[2]._vptr_Opnd);
    pRVar6 = IR::Opnd::AsRegOpnd(pOVar5);
    IR::AutoReuseOpnd::Initialize
              ((AutoReuseOpnd *)local_70,&pRVar6->super_Opnd,(Func *)src1[2]._vptr_Opnd,false);
    pOVar5 = LoadVTableValueOpnd(this,(Instr *)src1,VtableJavascriptArray);
    pIVar7 = IR::IndirOpnd::New(pRVar6,0,TyUint64,(Func *)src1[2]._vptr_Opnd,false);
    InsertCompareBranch(this,&pIVar7->super_Opnd,pOVar5,BrEq_A,target_00,(Instr *)src1,false);
    pOVar5 = LoadVTableValueOpnd(this,(Instr *)src1,VtableNativeIntArray);
    pIVar7 = IR::IndirOpnd::New(pRVar6,0,TyUint64,(Func *)src1[2]._vptr_Opnd,false);
    InsertCompareBranch(this,&pIVar7->super_Opnd,pOVar5,BrEq_A,target_00,(Instr *)src1,false);
    pOVar5 = LoadVTableValueOpnd(this,(Instr *)src1,VtableNativeFloatArray);
    pIVar7 = IR::IndirOpnd::New(pRVar6,0,TyUint64,(Func *)src1[2]._vptr_Opnd,false);
    InsertCompareBranch(this,&pIVar7->super_Opnd,pOVar5,BrNeq_A,labelFail,(Instr *)src1,false);
    IR::Instr::InsertBefore((Instr *)src1,&target_00->super_Instr);
    uVar1 = autoReuseArrayOpnd._16_8_;
    uVar3 = Js::JavascriptArray::GetOffsetOfArrayFlags();
    pIVar7 = IR::IndirOpnd::New((RegOpnd *)uVar1,uVar3,TyUint8,this->m_func,false);
    pIVar8 = IR::IntConstOpnd::New(4,TyUint8,this->m_func,true);
    InsertTestBranch(&pIVar7->super_Opnd,&pIVar8->super_Opnd,BrEq_A,labelFail,(Instr *)src1);
    IR::AutoReuseOpnd::AutoReuseOpnd((AutoReuseOpnd *)&autoReuseHeadSegmentLengthOpnd.autoDelete);
    IR::AutoReuseOpnd::AutoReuseOpnd((AutoReuseOpnd *)&indirOpnd);
    uVar1 = autoReuseArrayOpnd._16_8_;
    uVar3 = Js::JavascriptArray::GetOffsetOfHead();
    pIVar7 = IR::IndirOpnd::New((RegOpnd *)uVar1,uVar3,TyUint64,this->m_func,false);
    pRVar6 = IR::RegOpnd::New(TyUint64,this->m_func);
    IR::AutoReuseOpnd::Initialize
              ((AutoReuseOpnd *)&autoReuseHeadSegmentLengthOpnd.autoDelete,&pRVar6->super_Opnd,
               this->m_func,true);
    InsertMove(&pRVar6->super_Opnd,&pIVar7->super_Opnd,(Instr *)src1,true);
    uVar3 = Js::SparseArraySegmentBase::GetOffsetOfLength();
    pIVar7 = IR::IndirOpnd::New(pRVar6,uVar3,TyUint32,this->m_func,false);
    IR::AutoReuseOpnd::Initialize((AutoReuseOpnd *)&indirOpnd,&pIVar7->super_Opnd,this->m_func,true)
    ;
    InsertCompareBranch(this,&pRVar4->super_Opnd,&pIVar7->super_Opnd,BrGe_A,labelFail,(Instr *)src1,
                        false);
    type = IR::Opnd::GetType(&pRVar4->super_Opnd);
    pIVar8 = IR::IntConstOpnd::New(0,type,this->m_func,false);
    InsertCompareBranch(this,&pRVar4->super_Opnd,&pIVar8->super_Opnd,BrLt_A,labelFail,(Instr *)src1,
                        false);
    pOVar5 = IR::Instr::GetDst((Instr *)src1);
    src = LoadLibraryValueOpnd(this,(Instr *)src1,ValueTrue);
    InsertMove(pOVar5,src,(Instr *)src1,true);
    InsertBranch(Br,target,(Instr *)src1);
    IR::Instr::InsertBefore((Instr *)src1,&labelFail->super_Instr);
    IR::Instr::InsertAfter((Instr *)src1,&target->super_Instr);
    IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&indirOpnd);
    IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&autoReuseHeadSegmentLengthOpnd.autoDelete);
    IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_70);
  }
  return;
}

Assistant:

void Lowerer::GenerateFastArrayIsIn(IR::Instr * instr)
{
    // operator "foo in bar"
    IR::Opnd* src1 = instr->GetSrc1(); // foo
    IR::Opnd* src2 = instr->GetSrc2(); // bar

    if (
        !src1->GetValueType().IsLikelyInt() ||
        // Do not do a fast path if we know for sure we don't have an int
        src1->IsNotInt() ||
        !src2->GetValueType().IsLikelyArray() ||
        !src2->GetValueType().HasNoMissingValues())
    {
        return;
    }

    IR::LabelInstr* helperLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func, true);
    IR::LabelInstr* doneLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func);
    IR::LabelInstr* isArrayLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func);

    IR::RegOpnd* src1Untagged = GenerateUntagVar(src1->AsRegOpnd(), helperLabel, instr);
    IR::RegOpnd* src2RegOpnd = IR::RegOpnd::New(TyMachPtr, m_func);
    InsertMove(src2RegOpnd, src2, instr);


    IR::AutoReuseOpnd autoReuseArrayOpnd;
    m_lowererMD.GenerateObjectTest(src2RegOpnd, instr, helperLabel);
    IR::RegOpnd* arrayOpnd = src2RegOpnd->Copy(instr->m_func)->AsRegOpnd();
    autoReuseArrayOpnd.Initialize(arrayOpnd, instr->m_func, false /* autoDelete */);

    IR::Opnd* vtableOpnd = LoadVTableValueOpnd(instr, VTableValue::VtableJavascriptArray);
    InsertCompareBranch(
        IR::IndirOpnd::New(arrayOpnd, 0, TyMachPtr, instr->m_func),
        vtableOpnd,
        Js::OpCode::BrEq_A,
        isArrayLabel,
        instr);

    vtableOpnd = LoadVTableValueOpnd(instr, VTableValue::VtableNativeIntArray);
    InsertCompareBranch(
        IR::IndirOpnd::New(arrayOpnd, 0, TyMachPtr, instr->m_func),
        vtableOpnd,
        Js::OpCode::BrEq_A,
        isArrayLabel,
        instr);

    vtableOpnd = LoadVTableValueOpnd(instr, VTableValue::VtableNativeFloatArray);
    InsertCompareBranch(
        IR::IndirOpnd::New(arrayOpnd, 0, TyMachPtr, instr->m_func),
        vtableOpnd,
        Js::OpCode::BrNeq_A,
        helperLabel,
        instr);

    instr->InsertBefore(isArrayLabel);

    InsertTestBranch(
        IR::IndirOpnd::New(src2RegOpnd, Js::JavascriptArray::GetOffsetOfArrayFlags(), TyUint8, m_func),
        IR::IntConstOpnd::New(static_cast<uint8>(Js::DynamicObjectFlags::HasNoMissingValues), TyUint8, m_func, true),
        Js::OpCode::BrEq_A,
        helperLabel,
        instr);

    IR::AutoReuseOpnd autoReuseHeadSegmentOpnd;
    IR::AutoReuseOpnd autoReuseHeadSegmentLengthOpnd;
    IR::IndirOpnd* indirOpnd = IR::IndirOpnd::New(src2RegOpnd, Js::JavascriptArray::GetOffsetOfHead(), TyMachPtr, this->m_func);
    IR::RegOpnd* headSegmentOpnd = IR::RegOpnd::New(TyMachPtr, this->m_func);
    autoReuseHeadSegmentOpnd.Initialize(headSegmentOpnd, m_func);
    InsertMove(headSegmentOpnd, indirOpnd, instr);

    IR::Opnd* headSegmentLengthOpnd = IR::IndirOpnd::New(headSegmentOpnd, Js::SparseArraySegmentBase::GetOffsetOfLength(), TyUint32, m_func);
    autoReuseHeadSegmentLengthOpnd.Initialize(headSegmentLengthOpnd, m_func);

    InsertCompareBranch(
        src1Untagged,
        headSegmentLengthOpnd,
        Js::OpCode::BrGe_A,
        helperLabel,
        instr);
    InsertCompareBranch(
        src1Untagged,
        IR::IntConstOpnd::New(0, src1Untagged->GetType(), this->m_func),
        Js::OpCode::BrLt_A,
        helperLabel,
        instr);

    InsertMove(instr->GetDst(), LoadLibraryValueOpnd(instr, LibraryValue::ValueTrue), instr);
    InsertBranch(Js::OpCode::Br, doneLabel, instr);

    instr->InsertBefore(helperLabel);

    instr->InsertAfter(doneLabel);
}